

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchncnn.cpp
# Opt level: O1

void benchmark(char *comment,Mat *_in,Option *opt)

{
  int *piVar1;
  undefined4 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  uint uVar6;
  long lVar7;
  ulong uVar8;
  int iVar9;
  double dVar10;
  double dVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  int iVar15;
  undefined1 auVar14 [16];
  DataReaderFromEmpty dr;
  Mat out;
  Extractor ex;
  Net net;
  char parampath [256];
  double local_2b0;
  double local_2a0;
  double local_298;
  DataReader local_290;
  undefined1 local_288 [52];
  int iStack_254;
  size_t local_250;
  double local_240;
  undefined1 local_238 [32];
  undefined1 local_218 [16];
  undefined1 local_208 [16];
  Extractor local_1f0;
  Net local_1a8;
  char local_138 [264];
  
  local_288._0_8_ = _in->data;
  piVar1 = _in->refcount;
  local_288._8_4_ = SUB84(piVar1,0);
  local_288._12_4_ = (undefined4)((ulong)piVar1 >> 0x20);
  local_288._16_8_ = _in->elemsize;
  local_288._24_4_ = _in->elempack;
  local_288._32_8_ = _in->allocator;
  uVar2 = _in->c;
  local_288._40_4_ = _in->dims;
  local_288._44_4_ = _in->w;
  local_288._48_4_ = _in->h;
  unique0x100003f9 = _in->c;
  local_250 = _in->cstep;
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + 1;
    UNLOCK();
  }
  auVar5 = _DAT_00174030;
  auVar4 = _DAT_00174020;
  auVar3 = _DAT_00174010;
  uVar6 = uVar2 * (int)local_250;
  if (0 < (int)uVar6) {
    lVar7 = (ulong)uVar6 - 1;
    auVar12._8_4_ = (int)lVar7;
    auVar12._0_8_ = lVar7;
    auVar12._12_4_ = (int)((ulong)lVar7 >> 0x20);
    uVar8 = 0;
    auVar12 = auVar12 ^ _DAT_00174030;
    do {
      auVar13._8_4_ = (int)uVar8;
      auVar13._0_8_ = uVar8;
      auVar13._12_4_ = (int)(uVar8 >> 0x20);
      auVar14 = (auVar13 | auVar4) ^ auVar5;
      iVar9 = auVar12._4_4_;
      if ((bool)(~(auVar14._4_4_ == iVar9 && auVar12._0_4_ < auVar14._0_4_ || iVar9 < auVar14._4_4_)
                & 1)) {
        *(undefined4 *)(local_288._0_8_ + uVar8 * 4) = 0x3c23d70a;
      }
      if ((auVar14._12_4_ != auVar12._12_4_ || auVar14._8_4_ <= auVar12._8_4_) &&
          auVar14._12_4_ <= auVar12._12_4_) {
        *(undefined4 *)(local_288._0_8_ + uVar8 * 4 + 4) = 0x3c23d70a;
      }
      auVar13 = (auVar13 | auVar3) ^ auVar5;
      iVar15 = auVar13._4_4_;
      if (iVar15 <= iVar9 && (iVar15 != iVar9 || auVar13._0_4_ <= auVar12._0_4_)) {
        *(undefined4 *)(local_288._0_8_ + uVar8 * 4 + 8) = 0x3c23d70a;
        *(undefined4 *)(local_288._0_8_ + uVar8 * 4 + 0xc) = 0x3c23d70a;
      }
      uVar8 = uVar8 + 4;
    } while ((uVar6 + 3 & 0xfffffffc) != uVar8);
  }
  ncnn::Net::Net(&local_1a8);
  local_1a8.opt.use_int8_arithmetic = opt->use_int8_arithmetic;
  local_1a8.opt.use_packing_layout = opt->use_packing_layout;
  local_1a8.opt.lightmode = opt->lightmode;
  local_1a8.opt._1_3_ = *(undefined3 *)&opt->field_0x1;
  local_1a8.opt.num_threads = opt->num_threads;
  local_1a8.opt.blob_allocator = opt->blob_allocator;
  local_1a8.opt.workspace_allocator = opt->workspace_allocator;
  local_1a8.opt.use_winograd_convolution = opt->use_winograd_convolution;
  local_1a8.opt.use_sgemm_convolution = opt->use_sgemm_convolution;
  local_1a8.opt.use_int8_inference = opt->use_int8_inference;
  local_1a8.opt.use_vulkan_compute = opt->use_vulkan_compute;
  local_1a8.opt.use_fp16_packed = opt->use_fp16_packed;
  local_1a8.opt.use_fp16_storage = opt->use_fp16_storage;
  local_1a8.opt.use_fp16_arithmetic = opt->use_fp16_arithmetic;
  local_1a8.opt.use_int8_storage = opt->use_int8_storage;
  sprintf(local_138,"%s.param",comment);
  ncnn::Net::load_param(&local_1a8,local_138);
  local_290._vptr_DataReader = (_func_int **)&PTR__DataReader_0018b700;
  ncnn::Net::load_model(&local_1a8,&local_290);
  ncnn::UnlockedPoolAllocator::clear(&g_blob_pool_allocator);
  ncnn::PoolAllocator::clear(&g_workspace_pool_allocator);
  sleep(10);
  local_238._16_12_ = SUB1612((undefined1  [16])0x0,4);
  local_238._0_8_ = (void *)0x0;
  local_238._8_4_ = 0;
  local_238._12_4_ = 0;
  local_218 = (undefined1  [16])0x0;
  local_208 = (undefined1  [16])0x0;
  iVar9 = 8;
  do {
    ncnn::Net::create_extractor(&local_1f0,&local_1a8);
    ncnn::Extractor::input(&local_1f0,"data",(Mat *)local_288);
    ncnn::Extractor::extract(&local_1f0,"output",(Mat *)local_238);
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector(&local_1f0.blob_mats);
    iVar9 = iVar9 + -1;
  } while (iVar9 != 0);
  if (g_loop_count < 1) {
    local_2b0 = 0.0;
    dVar11 = 1.79769313486232e+308;
    dVar10 = -1.79769313486232e+308;
  }
  else {
    local_298 = -1.79769313486232e+308;
    local_2a0 = 1.79769313486232e+308;
    local_2b0 = 0.0;
    iVar9 = 0;
    do {
      local_240 = ncnn::get_current_time();
      ncnn::Net::create_extractor(&local_1f0,&local_1a8);
      ncnn::Extractor::input(&local_1f0,"data",(Mat *)local_288);
      ncnn::Extractor::extract(&local_1f0,"output",(Mat *)local_238);
      std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector(&local_1f0.blob_mats);
      dVar10 = ncnn::get_current_time();
      dVar10 = dVar10 - local_240;
      dVar11 = dVar10;
      if (local_2a0 <= dVar10) {
        dVar11 = local_2a0;
      }
      local_2b0 = local_2b0 + dVar10;
      if (dVar10 <= local_298) {
        dVar10 = local_298;
      }
      iVar9 = iVar9 + 1;
      local_2a0 = dVar11;
      local_298 = dVar10;
    } while (iVar9 < g_loop_count);
  }
  fprintf(_stderr,"%20s  min = %7.2f  max = %7.2f  avg = %7.2f\n",dVar11,dVar10,
          local_2b0 / (double)g_loop_count,comment);
  piVar1 = (int *)CONCAT44(local_238._12_4_,local_238._8_4_);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      if ((Allocator *)local_218._0_8_ == (Allocator *)0x0) {
        if ((void *)local_238._0_8_ != (void *)0x0) {
          free((void *)local_238._0_8_);
        }
      }
      else {
        (*(*(_func_int ***)local_218._0_8_)[3])();
      }
    }
  }
  ncnn::DataReader::~DataReader(&local_290);
  ncnn::Net::~Net(&local_1a8);
  piVar1 = (int *)CONCAT44(local_288._12_4_,local_288._8_4_);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      if ((Allocator *)local_288._32_8_ == (Allocator *)0x0) {
        if ((void *)local_288._0_8_ != (void *)0x0) {
          free((void *)local_288._0_8_);
        }
      }
      else {
        (*(*(_func_int ***)local_288._32_8_)[3])();
      }
    }
  }
  return;
}

Assistant:

void benchmark(const char* comment, const ncnn::Mat& _in, const ncnn::Option& opt)
{
    ncnn::Mat in = _in;
    in.fill(0.01f);

    ncnn::Net net;

    net.opt = opt;

#if NCNN_VULKAN
    if (net.opt.use_vulkan_compute)
    {
        net.set_vulkan_device(g_vkdev);
    }
#endif // NCNN_VULKAN

    char parampath[256];
    sprintf(parampath, "%s.param", comment);
    net.load_param(parampath);

    DataReaderFromEmpty dr;
    net.load_model(dr);

    g_blob_pool_allocator.clear();
    g_workspace_pool_allocator.clear();

#if NCNN_VULKAN
    if (net.opt.use_vulkan_compute)
    {
        g_blob_vkallocator->clear();
        g_staging_vkallocator->clear();
    }
#endif // NCNN_VULKAN

    // sleep 10 seconds for cooling down SOC  :(
#ifdef _WIN32
    Sleep(10 * 1000);
#else
    sleep(10);
#endif

    ncnn::Mat out;

    // warm up
    for (int i=0; i<g_warmup_loop_count; i++)
    {
        ncnn::Extractor ex = net.create_extractor();
        ex.input("data", in);
        ex.extract("output", out);
    }

    double time_min = DBL_MAX;
    double time_max = -DBL_MAX;
    double time_avg = 0;

    for (int i=0; i<g_loop_count; i++)
    {
        double start = ncnn::get_current_time();

        {
            ncnn::Extractor ex = net.create_extractor();
            ex.input("data", in);
            ex.extract("output", out);
        }

        double end = ncnn::get_current_time();

        double time = end - start;

        time_min = std::min(time_min, time);
        time_max = std::max(time_max, time);
        time_avg += time;
    }

    time_avg /= g_loop_count;

    fprintf(stderr, "%20s  min = %7.2f  max = %7.2f  avg = %7.2f\n", comment, time_min, time_max, time_avg);
}